

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O1

bool __thiscall
QOpenGLProgramBinaryCache::load(QOpenGLProgramBinaryCache *this,QByteArray *cacheKey,uint programId)

{
  QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry> *this_00;
  QMutex *pQVar1;
  __pointer_type pQVar2;
  uint blobFormat;
  uint blobSize;
  QDebug QVar3;
  FdWrapper __fd;
  int iVar4;
  MemCacheEntry *pMVar5;
  ssize_t sVar6;
  int *piVar7;
  char *pcVar8;
  Latin1Content LVar9;
  undefined1 *puVar10;
  Latin1Content *pLVar11;
  Latin1Content *pLVar12;
  QOpenGLProgramBinaryCache *pQVar13;
  QOpenGLProgramBinaryCache *pQVar14;
  byte unaff_R12B;
  undefined1 *__n;
  undefined1 *__n_00;
  long in_FS_OFFSET;
  bool bVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  GLEnvInfo info;
  FdWrapper fdw;
  QDebug local_130;
  GLEnvInfo local_128;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  FdWrapper local_bc;
  QString local_b8;
  QByteArray local_98;
  QString local_80;
  DeferredFileRemove local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->m_mutex;
  if ((this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar15 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar15) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar15) goto LAB_0056bc19;
  }
  else {
LAB_0056bc19:
    QBasicMutex::lockInternal();
  }
  this_00 = &this->m_memCache;
  pQVar13 = (QOpenGLProgramBinaryCache *)this_00;
  pMVar5 = QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::relink(this_00,cacheKey);
  if (pMVar5 != (MemCacheEntry *)0x0) {
    pcVar8 = (pMVar5->blob).d.ptr;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)&QByteArray::_empty;
    }
    unaff_R12B = setProgramBinary(pQVar13,programId,pMVar5->format,pcVar8,
                                  (uint)(pMVar5->blob).d.size);
  }
  if (pMVar5 != (MemCacheEntry *)0x0) goto LAB_0056bc65;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char *)0x0;
  local_98.d.size = 0;
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  cacheFileName(&local_b8,this,cacheKey);
  local_68.fn.d.d = local_b8.d.d;
  local_68.fn.d.ptr = local_b8.d.ptr;
  local_68.fn.d.size = local_b8.d.size;
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.active = false;
  local_68._25_7_ = 0xaaaaaaaaaaaaaa;
  local_bc.fd = 0xaaaaaaaa;
  FdWrapper::FdWrapper(&local_bc,&local_b8);
  __fd.fd = local_bc.fd;
  if (local_bc.fd == 0xffffffff) {
LAB_0056bf70:
    unaff_R12B = false;
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    do {
      pQVar13 = (QOpenGLProgramBinaryCache *)(ulong)(uint)__fd.fd;
      sVar6 = ::read(__fd.fd,&local_48,0x10);
      if (sVar6 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    pQVar14 = (QOpenGLProgramBinaryCache *)local_98.d.d;
    if (sVar6 == 0x10) {
      local_98.d.d = (Data *)0x0;
      local_98.d.size = 0x10;
      pQVar13 = pQVar14;
      local_98.d.ptr = (char *)&local_48;
      if (pQVar14 != (QOpenGLProgramBinaryCache *)0x0) {
        LOCK();
        *(int *)&(((QString *)&((Data *)pQVar14)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&((Data *)pQVar14)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&((Data *)pQVar14)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)pQVar14,1,0x10);
          pQVar13 = pQVar14;
        }
      }
    }
    bVar15 = verifyHeader(pQVar13,&local_98);
    if (!bVar15) {
      local_68.active = true;
      goto LAB_0056bf70;
    }
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
    FdWrapper::map((FdWrapper *)&local_d8);
    puVar10 = puStack_d0;
    if (puStack_d0 == (undefined1 *)0xffffffffffffffff) {
      local_68.active = true;
      unaff_R12B = false;
    }
    else {
      local_128.glversion.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_128.glversion.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.glversion.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_128.glrenderer.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_128.glrenderer.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_128.glvendor.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_128.glrenderer.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.glvendor.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.glvendor.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      anon_unknown.dwarf_1b56d22::GLEnvInfo::GLEnvInfo(&local_128);
      LVar9 = *(Latin1Content *)(puVar10 + 0x10);
      __n = (undefined1 *)(ulong)LVar9;
      if (((undefined1 *)local_128.glvendor.d.size == __n) &&
         ((__n == (undefined1 *)0x0 ||
          (iVar4 = bcmp(puVar10 + 0x14,local_128.glvendor.d.ptr,(size_t)__n), iVar4 == 0)))) {
        pLVar11 = (Latin1Content *)(puVar10 + (long)(__n + 0x14));
        LVar9 = *pLVar11;
        __n_00 = (undefined1 *)(ulong)LVar9;
        if (((undefined1 *)local_128.glrenderer.d.size != __n_00) ||
           ((__n_00 != (undefined1 *)0x0 &&
            (iVar4 = bcmp(puVar10 + (long)(__n + 0x18),local_128.glrenderer.d.ptr,(size_t)__n_00),
            iVar4 != 0)))) {
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            QMessageLogger::debug();
            QVar3.stream = local_130.stream;
            QVar17.m_data = (storage_type *)0x1a;
            QVar17.m_size = (qsizetype)&local_80;
            QString::fromUtf8(QVar17);
            QTextStream::operator<<(&(QVar3.stream)->ts,&local_80);
            if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((local_130.stream)->space == true) {
              QTextStream::operator<<(&(local_130.stream)->ts,' ');
            }
            QDebug::putByteArray((char *)&local_130,(ulong)(puVar10 + (long)(__n + 0x18)),LVar9);
            if ((local_130.stream)->space == true) {
              QTextStream::operator<<(&(local_130.stream)->ts,' ');
            }
            LVar9 = (Latin1Content)local_128.glrenderer.d.size;
            pcVar8 = local_128.glrenderer.d.ptr;
            goto LAB_0056c1cc;
          }
          goto LAB_0056c204;
        }
        pLVar12 = (Latin1Content *)((long)pLVar11 + (long)(__n_00 + 4));
        LVar9 = *pLVar12;
        puVar10 = (undefined1 *)(ulong)LVar9;
        if (((undefined1 *)local_128.glversion.d.size != puVar10) ||
           ((puVar10 != (undefined1 *)0x0 &&
            (iVar4 = bcmp((undefined1 *)((long)pLVar11 + (long)(__n_00 + 8)),
                          local_128.glversion.d.ptr,(size_t)puVar10), iVar4 != 0)))) {
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            QMessageLogger::debug();
            QVar3.stream = local_130.stream;
            QVar18.m_data = (storage_type *)0x19;
            QVar18.m_size = (qsizetype)&local_80;
            QString::fromUtf8(QVar18);
            QTextStream::operator<<(&(QVar3.stream)->ts,&local_80);
            if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((local_130.stream)->space == true) {
              QTextStream::operator<<(&(local_130.stream)->ts,' ');
            }
            QDebug::putByteArray
                      ((char *)&local_130,(ulong)((long)pLVar11 + (long)(__n_00 + 8)),LVar9);
            if ((local_130.stream)->space == true) {
              QTextStream::operator<<(&(local_130.stream)->ts,' ');
            }
            LVar9 = (Latin1Content)local_128.glversion.d.size;
            pcVar8 = local_128.glversion.d.ptr;
            goto LAB_0056c1cc;
          }
          goto LAB_0056c204;
        }
        blobFormat = *(uint *)((long)pLVar12 + (long)(puVar10 + 4));
        blobSize = *(uint *)((long)pLVar12 + (long)(puVar10 + 8));
        pcVar8 = (char *)((long)pLVar12 + (long)(puVar10 + 4) +
                         (((ulong)(puVar10 + (long)(__n + (long)__n_00) + 0x27) & 0xfffffffffffffffc
                          ) - (long)(__n + (long)__n_00 + (long)puVar10)) + -0x1c);
        bVar15 = setProgramBinary((QOpenGLProgramBinaryCache *)(ulong)blobFormat,programId,
                                  blobFormat,pcVar8,blobSize);
        if (!bVar15) goto LAB_0056c20c;
        pMVar5 = (MemCacheEntry *)operator_new(0x20);
        QByteArray::QByteArray((QByteArray *)pMVar5,pcVar8,(long)(int)blobSize);
        pMVar5->format = blobFormat;
        unaff_R12B = QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::insert
                               (this_00,cacheKey,pMVar5,1);
      }
      else {
        QtPrivateLogging::lcOpenGLProgramDiskCache();
        if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                   _q_value._M_base._M_i & 1) != 0) {
          QMessageLogger::debug();
          QVar3.stream = local_130.stream;
          QVar16.m_data = (storage_type *)0x18;
          QVar16.m_size = (qsizetype)&local_80;
          QString::fromUtf8(QVar16);
          QTextStream::operator<<(&(QVar3.stream)->ts,&local_80);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((local_130.stream)->space == true) {
            QTextStream::operator<<(&(local_130.stream)->ts,' ');
          }
          QDebug::putByteArray((char *)&local_130,(ulong)(puVar10 + 0x14),LVar9);
          if ((local_130.stream)->space == true) {
            QTextStream::operator<<(&(local_130.stream)->ts,' ');
          }
          LVar9 = (Latin1Content)local_128.glvendor.d.size;
          pcVar8 = local_128.glvendor.d.ptr;
LAB_0056c1cc:
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)&QByteArray::_empty;
          }
          QDebug::putByteArray((char *)&local_130,(ulong)pcVar8,LVar9);
          if ((local_130.stream)->space == true) {
            QTextStream::operator<<(&(local_130.stream)->ts,' ');
          }
          QDebug::~QDebug(&local_130);
        }
LAB_0056c204:
        local_68.active = true;
LAB_0056c20c:
        unaff_R12B = false;
      }
      if (&(local_128.glversion.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.glversion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.glversion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_128.glversion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_128.glversion.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_128.glrenderer.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.glrenderer.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.glrenderer.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_128.glrenderer.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_128.glrenderer.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_128.glvendor.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.glvendor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.glvendor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_128.glvendor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_128.glvendor.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    if (puStack_d0 != (undefined1 *)0xffffffffffffffff) {
      munmap(puStack_d0,(size_t)local_d8);
    }
  }
  FdWrapper::~FdWrapper(&local_bc);
  DeferredFileRemove::~DeferredFileRemove(&local_68);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QOpenGLProgramBinaryCache *)local_98.d.d != (QOpenGLProgramBinaryCache *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_98.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0056bc65:
  LOCK();
  pQVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar2 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(unaff_R12B & 1);
}

Assistant:

bool QOpenGLProgramBinaryCache::load(const QByteArray &cacheKey, uint programId)
{
    QMutexLocker lock(&m_mutex);
    if (const MemCacheEntry *e = m_memCache.object(cacheKey))
        return setProgramBinary(programId, e->format, e->blob.constData(), e->blob.size());

    QByteArray buf;
    const QString fn = cacheFileName(cacheKey);
    DeferredFileRemove undertaker(fn);
#ifdef Q_OS_UNIX
    FdWrapper fdw(fn);
    if (fdw.fd == -1)
        return false;
    char header[BASE_HEADER_SIZE];
    qint64 bytesRead = qt_safe_read(fdw.fd, header, BASE_HEADER_SIZE);
    if (bytesRead == BASE_HEADER_SIZE)
        buf = QByteArray::fromRawData(header, BASE_HEADER_SIZE);
#else
    QFile f(fn);
    if (!f.open(QIODevice::ReadOnly))
        return false;
    buf = f.read(BASE_HEADER_SIZE);
#endif

    if (!verifyHeader(buf)) {
        undertaker.setActive();
        return false;
    }

    const uchar *p;
#ifdef Q_OS_UNIX
    const auto map = fdw.map();
    if (!map) {
        undertaker.setActive();
        return false;
    }
    p = static_cast<const uchar *>(map.ptr) + BASE_HEADER_SIZE;
#else
    buf = f.readAll();
    p = reinterpret_cast<const uchar *>(buf.constData());
#endif

    GLEnvInfo info;

    QByteArray vendor = readStr(&p);
    if (vendor != info.glvendor) {
        // readStr returns non-null terminated strings just pointing to inside
        // 'p' so must print these via the stream qCDebug and not constData().
        qCDebug(lcOpenGLProgramDiskCache) << "GL_VENDOR does not match" << vendor << info.glvendor;
        undertaker.setActive();
        return false;
    }
    QByteArray renderer = readStr(&p);
    if (renderer != info.glrenderer) {
        qCDebug(lcOpenGLProgramDiskCache) << "GL_RENDERER does not match" << renderer << info.glrenderer;
        undertaker.setActive();
        return false;
    }
    QByteArray version = readStr(&p);
    if (version != info.glversion) {
        qCDebug(lcOpenGLProgramDiskCache) <<  "GL_VERSION does not match" << version << info.glversion;
        undertaker.setActive();
        return false;
    }

    quint32 blobFormat = readUInt(&p);
    quint32 blobSize = readUInt(&p);

    p += PADDING_SIZE(FULL_HEADER_SIZE(vendor.size() + renderer.size() + version.size()));

    return setProgramBinary(programId, blobFormat, p, blobSize)
        && m_memCache.insert(cacheKey, new MemCacheEntry(p, blobSize, blobFormat));
}